

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButtonPrivate::emitClicked(QAbstractButtonPrivate *this)

{
  long lVar1;
  bool bVar2;
  QAbstractButton *this_00;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *q;
  QPointer<QAbstractButton> guard;
  QAbstractButton *in_stack_ffffffffffffffc8;
  QAbstractButton *_t1;
  QAbstractButton *button;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  button = (QAbstractButton *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QAbstractButton>::QPointer<void>
            ((QPointer<QAbstractButton> *)in_RDI,in_stack_ffffffffffffffc8);
  QAbstractButton::clicked
            ((QAbstractButton *)0x4ff54e,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff558);
  if ((bVar2) && (in_RDI->group != (QButtonGroup *)0x0)) {
    _t1 = (QAbstractButton *)in_RDI->group;
    QButtonGroup::id((QButtonGroup *)this_00,button);
    QButtonGroup::idClicked((QButtonGroup *)0x4ff599,(int)((ulong)_t1 >> 0x20));
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff5a3);
    if ((bVar2) && (in_RDI->group != (QButtonGroup *)0x0)) {
      QButtonGroup::buttonClicked((QButtonGroup *)0x4ff5ce,_t1);
    }
  }
  QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x4ff5da);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::emitClicked()
{
    Q_Q(QAbstractButton);
    QPointer<QAbstractButton> guard(q);
    emit q->clicked(checked);
#if QT_CONFIG(buttongroup)
    if (guard && group) {
        emit group->idClicked(group->id(q));
        if (guard && group)
            emit group->buttonClicked(q);
    }
#endif
}